

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.hpp
# Opt level: O0

void __thiscall glu::StructMember::StructMember(StructMember *this,char *name,VarType *type)

{
  allocator<char> local_21;
  VarType *local_20;
  VarType *type_local;
  char *name_local;
  StructMember *this_local;
  
  local_20 = type;
  type_local = (VarType *)name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name,&local_21);
  std::allocator<char>::~allocator(&local_21);
  glu::VarType::VarType(&this->m_type,local_20);
  return;
}

Assistant:

StructMember	(const char* name, const VarType& type) : m_name(name), m_type(type) {}